

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

ON_2fVector * __thiscall ON_2fVector::operator=(ON_2fVector *this,double *v)

{
  ON_2fVector OVar1;
  
  if (v == (double *)0x0) {
    OVar1.x = 0.0;
    OVar1.y = 0.0;
  }
  else {
    OVar1.x = (float)*v;
    OVar1.y = (float)v[1];
  }
  *this = OVar1;
  return this;
}

Assistant:

ON_2fVector& ON_2fVector::operator=(const double* v)
{
  if ( v ) {
    x = (float)v[0];
    y = (float)v[1];
  }
  else {
    x = y = 0.0;
  }
  return *this;
}